

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * duckdb_fmt::v6::internal::
       parse_align<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  byte bVar1;
  char cVar2;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *this;
  basic_format_specs<char> *pbVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  byte bVar7;
  char *pcVar8;
  size_type __dnew;
  string local_78;
  string local_58;
  size_type local_38;
  
  pcVar8 = begin + 1;
  uVar5 = (ulong)(pcVar8 != end);
  do {
    bVar1 = begin[uVar5];
    bVar6 = true;
    bVar4 = false;
    if (bVar1 < 0x3e) {
      if (bVar1 == 0x3c) {
        bVar7 = 1;
        goto LAB_01296b83;
      }
      bVar7 = 0;
      bVar4 = false;
      if (bVar1 == 0x3d) {
        bVar7 = 4;
        bVar4 = true;
        bVar6 = false;
      }
    }
    else {
      if (bVar1 == 0x3e) {
        bVar7 = 2;
      }
      else {
        bVar7 = 0;
        if (bVar1 != 0x5e) goto LAB_01296b88;
        bVar7 = 3;
      }
LAB_01296b83:
      bVar6 = false;
      bVar4 = false;
    }
LAB_01296b88:
    if (!bVar6) {
      if (0 < (long)uVar5) {
        cVar2 = *begin;
        if (cVar2 == '{') {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"invalid fill character \'{\'","");
          specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                     ,&local_78);
          pcVar8 = begin;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
        }
        else {
          pcVar8 = begin + 2;
          (((handler->
            super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            ).super_specs_setter<char>.specs_)->fill).data_[0] = cVar2;
        }
        if (cVar2 == '{') {
          return begin;
        }
      }
      if ((bVar4) && (0xb < (handler->checker_).arg_type_ - named_arg_type)) {
        this = (handler->checker_).error_handler_;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_38 = 0x2a;
        local_58._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
        local_58.field_2._M_allocated_capacity = local_38;
        builtin_strncpy(local_58._M_dataplus._M_p,"format specifier requires numeric argument",0x2a)
        ;
        local_58._M_string_length = local_38;
        local_58._M_dataplus._M_p[local_38] = '\0';
        specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_error(this,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      pbVar3 = (handler->
               super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar3->field_0x9 = pbVar3->field_0x9 & 0xf0 | bVar7;
      return pcVar8;
    }
    bVar4 = (long)uVar5 < 1;
    uVar5 = uVar5 - 1;
    if (bVar4) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}